

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndGroup(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiGroupData *pIVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  float fVar7;
  ImVec2 size;
  ImVec2 nav_bb_arg;
  ImVec2 IVar8;
  bool group_contains_curr_hovered_id;
  bool group_contains_prev_active_id;
  bool group_contains_curr_active_id;
  ImRect group_bb;
  ImGuiGroupData *group_data;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined5 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffad;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  ImVec2 *rhs;
  undefined5 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbd;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  ImVec2 in_stack_ffffffffffffffd8;
  ImVec2 local_20;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar3 = ImVector<ImGuiGroupData>::back(&GImGui->GroupStack);
  if (((pIVar1->DC).IsSetPos & 1U) != 0) {
    ErrorCheckUsingSetCursorPosToExtendParentBoundaries();
  }
  rhs = &pIVar3->BackupCursorPos;
  size = ImMax((ImVec2 *)
               CONCAT17(in_stack_ffffffffffffffbf,
                        CONCAT16(in_stack_ffffffffffffffbe,
                                 CONCAT15(in_stack_ffffffffffffffbd,in_stack_ffffffffffffffb8))),rhs
              );
  ImRect::ImRect((ImRect *)&stack0xffffffffffffffd8,rhs,(ImVec2 *)&stack0xffffffffffffffd0);
  (pIVar1->DC).CursorPos = pIVar3->BackupCursorPos;
  nav_bb_arg = ImMax((ImVec2 *)
                     CONCAT17(in_stack_ffffffffffffffbf,
                              CONCAT16(in_stack_ffffffffffffffbe,
                                       CONCAT15(in_stack_ffffffffffffffbd,in_stack_ffffffffffffffb8)
                                      )),rhs);
  (pIVar1->DC).CursorMaxPos = nav_bb_arg;
  (pIVar1->DC).Indent.x = (pIVar3->BackupIndent).x;
  (pIVar1->DC).GroupOffset.x = (pIVar3->BackupGroupOffset).x;
  (pIVar1->DC).CurrLineSize = pIVar3->BackupCurrLineSize;
  (pIVar1->DC).CurrLineTextBaseOffset = pIVar3->BackupCurrLineTextBaseOffset;
  if ((pIVar2->LogEnabled & 1U) != 0) {
    pIVar2->LogLinePosY = -3.4028235e+38;
  }
  if ((pIVar3->EmitItem & 1U) == 0) {
    ImVector<ImGuiGroupData>::pop_back(&pIVar2->GroupStack);
  }
  else {
    fVar7 = ImMax<float>((pIVar1->DC).PrevLineTextBaseOffset,pIVar3->BackupCurrLineTextBaseOffset);
    (pIVar1->DC).CurrLineTextBaseOffset = fVar7;
    IVar8 = ImRect::GetSize((ImRect *)
                            CONCAT17(in_stack_ffffffffffffffaf,
                                     CONCAT16(in_stack_ffffffffffffffae,
                                              CONCAT15(in_stack_ffffffffffffffad,
                                                       in_stack_ffffffffffffffa8))));
    fVar7 = IVar8.y;
    ItemSize((ImVec2 *)size,nav_bb_arg.y);
    ItemAdd((ImRect *)in_stack_ffffffffffffffd8,(ImGuiID)size.y,(ImRect *)nav_bb_arg,
            (ImGuiItemFlags)fVar7);
    bVar4 = false;
    if ((pIVar3->BackupActiveIdIsAlive != pIVar2->ActiveId) &&
       (bVar4 = false, pIVar2->ActiveIdIsAlive == pIVar2->ActiveId)) {
      bVar4 = pIVar2->ActiveId != 0;
    }
    bVar5 = false;
    if ((pIVar3->BackupActiveIdPreviousFrameIsAlive & 1U) == 0) {
      bVar5 = (pIVar2->ActiveIdPreviousFrameIsAlive & 1U) == 1;
    }
    if (bVar4) {
      (pIVar2->LastItemData).ID = pIVar2->ActiveId;
    }
    else if (bVar5) {
      (pIVar2->LastItemData).ID = pIVar2->ActiveIdPreviousFrame;
    }
    (pIVar2->LastItemData).Rect.Min = in_stack_ffffffffffffffd8;
    (pIVar2->LastItemData).Rect.Max = local_20;
    bVar6 = false;
    if ((pIVar3->BackupHoveredIdIsAlive & 1U) == 0) {
      bVar6 = pIVar2->HoveredId != 0;
    }
    if (bVar6) {
      (pIVar2->LastItemData).StatusFlags = (pIVar2->LastItemData).StatusFlags | 0x80;
    }
    if ((bVar4) && ((pIVar2->ActiveIdHasBeenEditedThisFrame & 1U) != 0)) {
      (pIVar2->LastItemData).StatusFlags = (pIVar2->LastItemData).StatusFlags | 4;
    }
    (pIVar2->LastItemData).StatusFlags = (pIVar2->LastItemData).StatusFlags | 0x20;
    if ((bVar5) && (pIVar2->ActiveId != pIVar2->ActiveIdPreviousFrame)) {
      (pIVar2->LastItemData).StatusFlags = (pIVar2->LastItemData).StatusFlags | 0x40;
    }
    ImVector<ImGuiGroupData>::pop_back(&pIVar2->GroupStack);
  }
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.GroupStack.Size > 0); // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = g.GroupStack.back();
    IM_ASSERT(group_data.WindowID == window->ID); // EndGroup() in wrong window?

    if (window->DC.IsSetPos)
        ErrorCheckUsingSetCursorPosToExtendParentBoundaries();

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return

    if (!group_data.EmitItem)
    {
        g.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0, NULL, ImGuiItemFlags_NoTabStop);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The two tests not the same because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = (group_data.BackupActiveIdPreviousFrameIsAlive == false) && (g.ActiveIdPreviousFrameIsAlive == true);
    if (group_contains_curr_active_id)
        g.LastItemData.ID = g.ActiveId;
    else if (group_contains_prev_active_id)
        g.LastItemData.ID = g.ActiveIdPreviousFrame;
    g.LastItemData.Rect = group_bb;

    // Forward Hovered flag
    const bool group_contains_curr_hovered_id = (group_data.BackupHoveredIdIsAlive == false) && g.HoveredId != 0;
    if (group_contains_curr_hovered_id)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredWindow;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Deactivated;

    g.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}